

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::LoadAsset
               (AssetResolutionResolver *resolver,string *current_working_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *search_paths,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
               *fileformats,AssetPath *assetPath,Path *primPath,Layer *dst_layer,
               PrimSpec **dst_primspec_root,bool error_when_no_prims_found,
               bool error_when_asset_not_found,bool error_when_unsupported_fileformat,string *warn,
               string *err)

{
  undefined8 ps_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  ulong uVar4;
  long lVar5;
  size_type sVar6;
  size_type sVar7;
  uint8_t *addr;
  size_t length;
  mapped_type *pmVar8;
  key_type *__k;
  mapped_type *pmVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *puVar10;
  LayerMetas *pLVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  void *userdata;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  string local_4e28 [32];
  ostringstream local_4e08 [8];
  ostringstream ss_e_15;
  string local_4c90 [32];
  ostringstream local_4c70 [8];
  ostringstream ss_e_14;
  string local_4af8 [39];
  allocator local_4ad1;
  string local_4ad0 [32];
  string local_4ab0;
  ostringstream local_4a90 [8];
  ostringstream ss_e_13;
  allocator local_4911;
  string local_4910;
  Path local_48f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  local_4820;
  string local_4818 [32];
  string local_47f8 [32];
  undefined1 local_47d8 [8];
  string default_prim;
  PrimSpec *src_ps;
  allocator local_4789;
  string local_4788 [32];
  fmt local_4768 [32];
  ostringstream local_4748 [8];
  ostringstream ss_e_12;
  string local_45d0 [39];
  allocator local_45a9;
  string local_45a8 [32];
  fmt local_4588 [32];
  ostringstream local_4568 [8];
  ostringstream ss_e_11;
  string local_43f0 [39];
  allocator local_43c9;
  string local_43c8 [32];
  fmt local_43a8 [32];
  ostringstream local_4388 [8];
  ostringstream ss_e_10;
  string local_4210 [39];
  allocator local_41e9;
  string local_41e8 [32];
  string local_41c8;
  ostringstream local_41a8 [8];
  ostringstream ss_e_9;
  FileFormatHandler *handler;
  PrimSpec ps_1;
  undefined1 local_3ab8 [71];
  allocator local_3a71;
  string local_3a70 [32];
  fmt local_3a50 [32];
  ostringstream local_3a30 [8];
  ostringstream ss_e_8;
  undefined1 local_38b8 [8];
  PrimSpec ps;
  string local_3330 [32];
  ostringstream local_3310 [8];
  ostringstream ss_e_7;
  string local_3198 [39];
  allocator local_3171;
  string local_3170 [32];
  string local_3150;
  ostringstream local_3130 [8];
  ostringstream ss_e_6;
  USDLoadOptions local_2fb8;
  undefined1 local_2f58 [8];
  string _err;
  string _warn;
  Layer layer;
  allocator local_18f9;
  string local_18f8 [32];
  fmt local_18d8 [32];
  ostringstream local_18b8 [8];
  ostringstream ss_w_6;
  string local_1740 [39];
  allocator local_1719;
  string local_1718 [32];
  fmt local_16f8 [32];
  ostringstream local_16d8 [8];
  ostringstream ss_e_5;
  string local_1560 [39];
  allocator local_1539;
  string local_1538 [32];
  fmt local_1518 [32];
  ostringstream local_14f8 [8];
  ostringstream ss_w_5;
  string local_1380 [39];
  allocator local_1359;
  string local_1358 [32];
  fmt local_1338 [32];
  ostringstream local_1318 [8];
  ostringstream ss_e_4;
  string local_11a0 [39];
  allocator local_1179;
  string local_1178 [32];
  fmt local_1158 [32];
  ostringstream local_1138 [8];
  ostringstream ss_e_3;
  undefined1 local_fc0 [8];
  Asset asset;
  string base_dir;
  allocator local_f01;
  string local_f00 [32];
  string local_ee0;
  ostringstream local_ec0 [8];
  ostringstream ss_w_4;
  string local_d48 [39];
  allocator local_d21;
  string local_d20 [32];
  string local_d00;
  ostringstream local_ce0 [8];
  ostringstream ss_w_3;
  string local_b68 [39];
  allocator local_b41;
  string local_b40 [32];
  fmt local_b20 [32];
  ostringstream local_b00 [8];
  ostringstream ss_w_2;
  string local_988 [39];
  allocator local_961;
  string local_960 [32];
  fmt local_940 [32];
  ostringstream local_920 [8];
  ostringstream ss_w_1;
  string local_7a8 [39];
  allocator local_781;
  string local_780 [32];
  fmt local_760 [32];
  ostringstream local_740 [8];
  ostringstream ss_w;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [32];
  fmt local_580 [32];
  ostringstream local_560 [8];
  ostringstream ss_e_2;
  undefined1 local_3e8 [8];
  string resolved_path;
  string local_3c0 [32];
  ostringstream local_3a0 [8];
  ostringstream ss_e_1;
  undefined1 local_228 [8];
  string ext;
  string asset_path;
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  bool error_when_unsupported_fileformat_local;
  bool error_when_asset_not_found_local;
  bool error_when_no_prims_found_local;
  Path *primPath_local;
  AssetPath *assetPath_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
  *fileformats_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *search_paths_local;
  string *current_working_path_local;
  AssetResolutionResolver *resolver_local;
  
  pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(CONCAT71((int7)((ulong)fileformats >> 8),error_when_asset_not_found) &
               0xffffffffffffff01);
  if (dst_layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xac);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1c8,
                               "[Internal error]. `dst_layer` output arg is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=
                ((string *)err,(string *)(asset_path.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)(asset_path.field_2._M_local_buf + 8));
    }
    resolver_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
    goto LAB_002258ce;
  }
  psVar3 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(assetPath);
  ::std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8),(string *)psVar3);
  GetExtension((string *)local_228,(string *)((long)&ext.field_2 + 8));
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    lVar5 = ::std::__cxx11::string::size();
    if (lVar5 != 0) {
      AssetResolutionResolver::set_current_working_path(resolver,current_working_path);
    }
    sVar6 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(search_paths);
    if (sVar6 != 0) {
      AssetResolutionResolver::set_search_paths(resolver,search_paths);
    }
    AssetResolutionResolver::resolve
              ((string *)local_3e8,resolver,(string *)((long)&ext.field_2 + 8));
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      AssetResolutionResolver::set_search_paths(resolver,search_paths);
      io::GetBaseDir((string *)
                     &asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_3e8);
      lVar5 = ::std::__cxx11::string::size();
      if (lVar5 != 0) {
        AssetResolutionResolver::set_current_working_path
                  (resolver,(string *)
                            &asset.buf_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        AssetResolutionResolver::add_search_path
                  (resolver,(string *)
                            &asset.buf_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      Asset::Asset((Asset *)local_fc0);
      args_2 = err;
      bVar1 = AssetResolutionResolver::open_asset
                        (resolver,(string *)local_3e8,(string *)((long)&ext.field_2 + 8),
                         (Asset *)local_fc0,warn,err);
      if (bVar1) {
        bVar1 = IsBuiltinFileFormat((string *)((long)&ext.field_2 + 8));
        if (bVar1) {
          bVar1 = IsUSDFileFormat((string *)((long)&ext.field_2 + 8));
          if ((bVar1) || (bVar1 = IsMtlxFileFormat((string *)((long)&ext.field_2 + 8)), bVar1))
          goto LAB_002245da;
          if (error_when_unsupported_fileformat) {
            ::std::__cxx11::ostringstream::ostringstream(local_1318);
            poVar2 = ::std::operator<<((ostream *)local_1318,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"LoadAsset");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x104);
            ::std::operator<<(poVar2," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1358,"TODO: Unknown/unsupported asset file format: {}",&local_1359);
            fmt::format<std::__cxx11::string>
                      (local_1338,(string *)local_1358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ext.field_2._M_local_buf + 8));
            poVar2 = ::std::operator<<((ostream *)local_1318,(string *)local_1338);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_1338);
            ::std::__cxx11::string::~string(local_1358);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1359);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_1380);
              ::std::__cxx11::string::~string(local_1380);
            }
            resolver_local._7_1_ = 0;
            resolved_path.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1318);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_14f8);
            poVar2 = ::std::operator<<((ostream *)local_14f8,"[warn]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"LoadAsset");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x108);
            ::std::operator<<(poVar2," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1538,"TODO: Unknown/unsupported asset file format. Skipped: {}",
                       &local_1539);
            fmt::format<std::__cxx11::string>
                      (local_1518,(string *)local_1538,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ext.field_2._M_local_buf + 8));
            poVar2 = ::std::operator<<((ostream *)local_14f8,(string *)local_1518);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_1518);
            ::std::__cxx11::string::~string(local_1538);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1539);
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)warn,local_1560);
              ::std::__cxx11::string::~string(local_1560);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_14f8);
            resolver_local._7_1_ = 1;
            resolved_path.field_2._12_4_ = 1;
          }
        }
        else {
          sVar7 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                  ::count(fileformats,(key_type *)local_228);
          if (sVar7 == 0) {
            if (error_when_unsupported_fileformat) {
              ::std::__cxx11::ostringstream::ostringstream(local_16d8);
              poVar2 = ::std::operator<<((ostream *)local_16d8,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"LoadAsset");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x114);
              ::std::operator<<(poVar2," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1718,"Unknown/unsupported asset file format: {}",&local_1719);
              fmt::format<std::__cxx11::string>
                        (local_16f8,(string *)local_1718,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ext.field_2._M_local_buf + 8));
              poVar2 = ::std::operator<<((ostream *)local_16d8,(string *)local_16f8);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::~string((string *)local_16f8);
              ::std::__cxx11::string::~string(local_1718);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1719);
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=((string *)err,local_1740);
                ::std::__cxx11::string::~string(local_1740);
              }
              resolver_local._7_1_ = 0;
              resolved_path.field_2._12_4_ = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_16d8);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_18b8);
              poVar2 = ::std::operator<<((ostream *)local_18b8,"[warn]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"LoadAsset");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x117);
              ::std::operator<<(poVar2," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_18f8,"Unknown/unsupported asset file format. Skipped: {}",&local_18f9
                        );
              fmt::format<std::__cxx11::string>
                        (local_18d8,(string *)local_18f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ext.field_2._M_local_buf + 8));
              poVar2 = ::std::operator<<((ostream *)local_18b8,(string *)local_18d8);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::~string((string *)local_18d8);
              ::std::__cxx11::string::~string(local_18f8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_18f9);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=
                          ((string *)warn,(string *)&layer._asset_resolution_userdata);
                ::std::__cxx11::string::~string((string *)&layer._asset_resolution_userdata);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_18b8);
              resolver_local._7_1_ = 1;
              resolved_path.field_2._12_4_ = 1;
            }
          }
          else {
LAB_002245da:
            Layer::Layer((Layer *)((long)&_warn.field_2 + 8));
            ::std::__cxx11::string::string((string *)(_err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::string((string *)local_2f58);
            bVar1 = IsUSDFileFormat((string *)((long)&ext.field_2 + 8));
            if (bVar1) {
              addr = Asset::data((Asset *)local_fc0);
              length = Asset::size((Asset *)local_fc0);
              memset(&local_2fb8,0,0x60);
              USDLoadOptions::USDLoadOptions(&local_2fb8);
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (_err.field_2._M_local_buf + 8);
              args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f58;
              bVar1 = LoadLayerFromMemory(addr,length,(string *)(ext.field_2._M_local_buf + 8),
                                          (Layer *)((long)&_warn.field_2 + 8),(string *)pbVar13,
                                          (string *)args_2,&local_2fb8);
              USDLoadOptions::~USDLoadOptions(&local_2fb8);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_3130);
                poVar2 = ::std::operator<<((ostream *)local_3130,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x125);
                ::std::operator<<(poVar2," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3170,"Failed to open `{}` as Layer: {}",&local_3171);
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          (&local_3150,(fmt *)local_3170,(string *)((long)&ext.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2f58,pbVar13);
                poVar2 = ::std::operator<<((ostream *)local_3130,(string *)&local_3150);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string((string *)&local_3150);
                ::std::__cxx11::string::~string(local_3170);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_3171);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_3198);
                  ::std::__cxx11::string::~string(local_3198);
                }
                resolver_local._7_1_ = 0;
                resolved_path.field_2._12_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_3130);
                goto LAB_0022586e;
              }
LAB_002250b1:
              lVar5 = ::std::__cxx11::string::size();
              if ((lVar5 != 0) && (warn != (string *)0x0)) {
                ::std::__cxx11::string::operator+=
                          ((string *)warn,(string *)(_err.field_2._M_local_buf + 8));
              }
              puVar10 = Layer::primspecs_abi_cxx11_((Layer *)((long)&_warn.field_2 + 8));
              bVar1 = ::std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                      ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                               *)puVar10);
              if (bVar1) {
                if (error_when_no_prims_found) {
                  ::std::__cxx11::ostringstream::ostringstream(local_4748);
                  poVar2 = ::std::operator<<((ostream *)local_4748,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x15a);
                  ::std::operator<<(poVar2," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string(local_4788,"No prims in layer `{}`",&local_4789);
                  fmt::format<std::__cxx11::string>
                            (local_4768,(string *)local_4788,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ext.field_2._M_local_buf + 8));
                  poVar2 = ::std::operator<<((ostream *)local_4748,(string *)local_4768);
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::string::~string((string *)local_4768);
                  ::std::__cxx11::string::~string(local_4788);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_4789);
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=((string *)err,(string *)&src_ps);
                    ::std::__cxx11::string::~string((string *)&src_ps);
                  }
                  resolver_local._7_1_ = 0;
                  resolved_path.field_2._12_4_ = 1;
                  ::std::__cxx11::ostringstream::~ostringstream(local_4748);
                }
                else {
                  if (dst_primspec_root != (PrimSpec **)0x0) {
                    *dst_primspec_root = (PrimSpec *)0x0;
                  }
                  Layer::operator=(dst_layer,(Layer *)((long)&_warn.field_2 + 8));
                  resolver_local._7_1_ = 1;
                  resolved_path.field_2._12_4_ = 1;
                }
              }
              else {
                default_prim.field_2._8_8_ = 0;
                if (dst_primspec_root != (PrimSpec **)0x0) {
                  ::std::__cxx11::string::string((string *)local_47d8);
                  bVar1 = Path::is_valid(primPath);
                  if (bVar1) {
                    psVar3 = Path::prim_part_abi_cxx11_(primPath);
                    ::std::__cxx11::string::operator=((string *)local_47d8,(string *)psVar3);
                  }
                  else {
                    pLVar11 = Layer::metas((Layer *)((long)&_warn.field_2 + 8));
                    bVar1 = Token::valid(&pLVar11->defaultPrim);
                    if (bVar1) {
                      pLVar11 = Layer::metas((Layer *)((long)&_warn.field_2 + 8));
                      Token::str_abi_cxx11_(&pLVar11->defaultPrim);
                      ::std::operator+((char *)local_47f8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x6399b1);
                      ::std::__cxx11::string::operator=((string *)local_47d8,local_47f8);
                      ::std::__cxx11::string::~string(local_47f8);
                    }
                    else {
                      puVar10 = Layer::primspecs_abi_cxx11_((Layer *)((long)&_warn.field_2 + 8));
                      local_4820._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                           ::begin(puVar10);
                      ::std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
                      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
                                    *)&local_4820);
                      ::std::operator+((char *)local_4818,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x6399b1);
                      ::std::__cxx11::string::operator=((string *)local_47d8,local_4818);
                      ::std::__cxx11::string::~string(local_4818);
                    }
                  }
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)&local_4910,"",&local_4911);
                  Path::Path(&local_48f0,(string *)local_47d8,&local_4910);
                  bVar1 = Layer::find_primspec_at
                                    ((Layer *)((long)&_warn.field_2 + 8),&local_48f0,
                                     (PrimSpec **)((long)&default_prim.field_2 + 8),err);
                  Path::~Path(&local_48f0);
                  ::std::__cxx11::string::~string((string *)&local_4910);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_4911);
                  ps_00 = default_prim.field_2._8_8_;
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    if (default_prim.field_2._8_8_ == 0) {
                      ::std::__cxx11::ostringstream::ostringstream(local_4c70);
                      poVar2 = ::std::operator<<((ostream *)local_4c70,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x180);
                      ::std::operator<<(poVar2," ");
                      poVar2 = ::std::operator<<((ostream *)local_4c70,
                                                 "Internal error: PrimSpec pointer is nullptr.");
                      ::std::operator<<(poVar2,"\n");
                      if (err != (string *)0x0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::__cxx11::string::operator+=((string *)err,local_4c90);
                        ::std::__cxx11::string::~string(local_4c90);
                      }
                      resolver_local._7_1_ = 0;
                      resolved_path.field_2._12_4_ = 1;
                      ::std::__cxx11::ostringstream::~ostringstream(local_4c70);
                    }
                    else {
                      psVar3 = AssetResolutionResolver::current_working_path_abi_cxx11_(resolver);
                      pvVar12 = AssetResolutionResolver::search_paths_abi_cxx11_(resolver);
                      bVar1 = PropagateAssetResolverState(0,(PrimSpec *)ps_00,psVar3,pvVar12);
                      if (bVar1) {
                        *dst_primspec_root = (PrimSpec *)default_prim.field_2._8_8_;
                        resolved_path.field_2._12_4_ = 0;
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_4e08);
                        poVar2 = ::std::operator<<((ostream *)local_4e08,"[error]");
                        poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                        poVar2 = ::std::operator<<(poVar2,":");
                        poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                        poVar2 = ::std::operator<<(poVar2,"():");
                        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x187);
                        ::std::operator<<(poVar2," ");
                        poVar2 = ::std::operator<<((ostream *)local_4e08,
                                                                                                      
                                                  "Store AssetResolver state to each PrimSpec failed.\n"
                                                  );
                        ::std::operator<<(poVar2,"\n");
                        if (err != (string *)0x0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::__cxx11::string::operator+=((string *)err,local_4e28);
                          ::std::__cxx11::string::~string(local_4e28);
                        }
                        resolver_local._7_1_ = 0;
                        resolved_path.field_2._12_4_ = 1;
                        ::std::__cxx11::ostringstream::~ostringstream(local_4e08);
                      }
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_4a90);
                    poVar2 = ::std::operator<<((ostream *)local_4a90,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x17c);
                    ::std::operator<<(poVar2," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_4ad0,
                               "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)",
                               &local_4ad1);
                    fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                              (&local_4ab0,(fmt *)local_4ad0,(string *)local_47d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&ext.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_3e8,args_2);
                    poVar2 = ::std::operator<<((ostream *)local_4a90,(string *)&local_4ab0);
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::string::~string((string *)&local_4ab0);
                    ::std::__cxx11::string::~string(local_4ad0);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_4ad1);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=((string *)err,local_4af8);
                      ::std::__cxx11::string::~string(local_4af8);
                    }
                    resolver_local._7_1_ = 0;
                    resolved_path.field_2._12_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_4a90);
                  }
                  ::std::__cxx11::string::~string((string *)local_47d8);
                  if (resolved_path.field_2._12_4_ != 0) goto LAB_0022586e;
                }
                psVar3 = AssetResolutionResolver::current_working_path_abi_cxx11_(resolver);
                pvVar12 = AssetResolutionResolver::search_paths_abi_cxx11_(resolver);
                userdata = AssetResolutionResolver::get_userdata(resolver);
                Layer::set_asset_resolution_state
                          ((Layer *)((long)&_warn.field_2 + 8),psVar3,pvVar12,userdata);
                Layer::operator=(dst_layer,(Layer *)((long)&_warn.field_2 + 8));
                resolver_local._7_1_ = 1;
                resolved_path.field_2._12_4_ = 1;
              }
            }
            else {
              bVar1 = IsMtlxFileFormat((string *)((long)&ext.field_2 + 8));
              if (bVar1) {
                psVar3 = Path::prim_part_abi_cxx11_(primPath);
                bVar1 = ::std::operator!=(psVar3,"/MaterialX");
                if (!bVar1) {
                  PrimSpec::PrimSpec((PrimSpec *)local_38b8);
                  bVar1 = LoadMaterialXFromAsset
                                    ((Asset *)local_fc0,(string *)((long)&ext.field_2 + 8),
                                     (PrimSpec *)local_38b8,(string *)((long)&_err.field_2 + 8),
                                     (string *)local_2f58);
                  if (bVar1) {
                    psVar3 = PrimSpec::name_abi_cxx11_((PrimSpec *)local_38b8);
                    ::std::__cxx11::string::operator=((string *)psVar3,"MaterialX");
                    puVar10 = Layer::primspecs_abi_cxx11_((Layer *)((long)&_warn.field_2 + 8));
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              ((string *)local_3ab8,"MaterialX",
                               (allocator *)
                               ((long)&ps_1._asset_search_paths.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                    pmVar9 = ::std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                                           *)puVar10,(key_type *)local_3ab8);
                    PrimSpec::operator=(pmVar9,(PrimSpec *)local_38b8);
                    ::std::__cxx11::string::~string((string *)local_3ab8);
                    ::std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)&ps_1._asset_search_paths.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                    resolved_path.field_2._12_4_ = 0;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_3a30);
                    poVar2 = ::std::operator<<((ostream *)local_3a30,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x131);
                    ::std::operator<<(poVar2," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_3a70,"Failed to open mtlx asset `{}`",&local_3a71);
                    fmt::format<std::__cxx11::string>
                              (local_3a50,(string *)local_3a70,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (ext.field_2._M_local_buf + 8));
                    poVar2 = ::std::operator<<((ostream *)local_3a30,(string *)local_3a50);
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::string::~string((string *)local_3a50);
                    ::std::__cxx11::string::~string(local_3a70);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a71);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=
                                ((string *)err,(string *)(local_3ab8 + 0x20));
                      ::std::__cxx11::string::~string((string *)(local_3ab8 + 0x20));
                    }
                    resolver_local._7_1_ = 0;
                    resolved_path.field_2._12_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_3a30);
                  }
                  PrimSpec::~PrimSpec((PrimSpec *)local_38b8);
                  goto joined_r0x00224ba2;
                }
                ::std::__cxx11::ostringstream::ostringstream(local_3310);
                poVar2 = ::std::operator<<((ostream *)local_3310,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,299);
                ::std::operator<<(poVar2," ");
                Path::prim_part_abi_cxx11_(primPath);
                ::std::operator+((char *)local_3330,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Prim path must be </MaterialX>, but got: ");
                poVar2 = ::std::operator<<((ostream *)local_3310,local_3330);
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::string::~string(local_3330);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=
                            ((string *)err,
                             (string *)
                             &ps._asset_search_paths.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  ::std::__cxx11::string::~string
                            ((string *)
                             &ps._asset_search_paths.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                resolver_local._7_1_ = 0;
                resolved_path.field_2._12_4_ = 1;
                ::std::__cxx11::ostringstream::~ostringstream(local_3310);
              }
              else {
                sVar7 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                        ::count(fileformats,(key_type *)local_228);
                if (sVar7 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream(local_4568);
                  poVar2 = ::std::operator<<((ostream *)local_4568,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x14a);
                  ::std::operator<<(poVar2," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_45a8,"FileFormat handler not found for asset `{}`",&local_45a9);
                  fmt::format<std::__cxx11::string>
                            (local_4588,(string *)local_45a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ext.field_2._M_local_buf + 8));
                  poVar2 = ::std::operator<<((ostream *)local_4568,(string *)local_4588);
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::string::~string((string *)local_4588);
                  ::std::__cxx11::string::~string(local_45a8);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_45a9);
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=((string *)err,local_45d0);
                    ::std::__cxx11::string::~string(local_45d0);
                  }
                  resolver_local._7_1_ = 0;
                  resolved_path.field_2._12_4_ = 1;
                  ::std::__cxx11::ostringstream::~ostringstream(local_4568);
                }
                else {
                  PrimSpec::PrimSpec((PrimSpec *)&handler);
                  pmVar8 = ::std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                           ::at(fileformats,(key_type *)local_228);
                  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pmVar8->userdata;
                  bVar1 = (*pmVar8->reader)((Asset *)local_fc0,(PrimSpec *)&handler,
                                            (string *)((long)&_err.field_2 + 8),(string *)local_2f58
                                            ,pbVar13);
                  if (bVar1) {
                    PrimSpec::name_abi_cxx11_((PrimSpec *)&handler);
                    uVar4 = ::std::__cxx11::string::empty();
                    if ((uVar4 & 1) == 0) {
                      puVar10 = Layer::primspecs_abi_cxx11_((Layer *)((long)&_warn.field_2 + 8));
                      __k = (key_type *)PrimSpec::name_abi_cxx11_((PrimSpec *)&handler);
                      pmVar9 = ::std::
                               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                                             *)puVar10,__k);
                      PrimSpec::operator=(pmVar9,(PrimSpec *)&handler);
                      resolved_path.field_2._12_4_ = 0;
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_4388);
                      poVar2 = ::std::operator<<((ostream *)local_4388,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x143);
                      ::std::operator<<(poVar2," ");
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                (local_43c8,"PrimSpec element_name is empty. asset `{}`",&local_43c9
                                );
                      fmt::format<std::__cxx11::string>
                                (local_43a8,(string *)local_43c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(ext.field_2._M_local_buf + 8));
                      poVar2 = ::std::operator<<((ostream *)local_4388,(string *)local_43a8);
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::string::~string((string *)local_43a8);
                      ::std::__cxx11::string::~string(local_43c8);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_43c9);
                      if (err != (string *)0x0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::__cxx11::string::operator+=((string *)err,local_43f0);
                        ::std::__cxx11::string::~string(local_43f0);
                      }
                      resolver_local._7_1_ = 0;
                      resolved_path.field_2._12_4_ = 1;
                      ::std::__cxx11::ostringstream::~ostringstream(local_4388);
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_41a8);
                    poVar2 = ::std::operator<<((ostream *)local_41a8,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x13e);
                    ::std::operator<<(poVar2," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_41e8,"Failed to read asset `{}` error: {}",&local_41e9);
                    fmt::format<std::__cxx11::string,std::__cxx11::string>
                              (&local_41c8,(fmt *)local_41e8,(string *)((long)&ext.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2f58,pbVar13);
                    poVar2 = ::std::operator<<((ostream *)local_41a8,(string *)&local_41c8);
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::string::~string((string *)&local_41c8);
                    ::std::__cxx11::string::~string(local_41e8);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_41e9);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=((string *)err,local_4210);
                      ::std::__cxx11::string::~string(local_4210);
                    }
                    resolver_local._7_1_ = 0;
                    resolved_path.field_2._12_4_ = 1;
                    ::std::__cxx11::ostringstream::~ostringstream(local_41a8);
                  }
                  PrimSpec::~PrimSpec((PrimSpec *)&handler);
joined_r0x00224ba2:
                  if (resolved_path.field_2._12_4_ == 0) goto LAB_002250b1;
                }
              }
            }
LAB_0022586e:
            ::std::__cxx11::string::~string((string *)local_2f58);
            ::std::__cxx11::string::~string((string *)(_err.field_2._M_local_buf + 8));
            Layer::~Layer((Layer *)((long)&_warn.field_2 + 8));
          }
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1138);
        poVar2 = ::std::operator<<((ostream *)local_1138,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"LoadAsset");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xf7);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1178,"Failed to open asset `{}`.",&local_1179);
        fmt::format<std::__cxx11::string>
                  (local_1158,(string *)local_1178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8);
        poVar2 = ::std::operator<<((ostream *)local_1138,(string *)local_1158);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_1158);
        ::std::__cxx11::string::~string(local_1178);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1179);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_11a0);
          ::std::__cxx11::string::~string(local_11a0);
        }
        resolver_local._7_1_ = 0;
        resolved_path.field_2._12_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1138);
      }
      Asset::~Asset((Asset *)local_fc0);
      ::std::__cxx11::string::~string
                ((string *)
                 &asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else if (error_when_asset_not_found) {
      ::std::__cxx11::ostringstream::ostringstream(local_560);
      poVar2 = ::std::operator<<((ostream *)local_560,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xca);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5a0,"Failed to resolve asset path `{}`",&local_5a1);
      fmt::format<std::__cxx11::string>
                (local_580,(string *)local_5a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ext.field_2._M_local_buf + 8));
      poVar2 = ::std::operator<<((ostream *)local_560,(string *)local_580);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_580);
      ::std::__cxx11::string::~string(local_5a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_5c8);
        ::std::__cxx11::string::~string(local_5c8);
      }
      resolver_local._7_1_ = 0;
      resolved_path.field_2._12_4_ = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_560);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_740);
      poVar2 = ::std::operator<<((ostream *)local_740,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xcc);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_780,"Asset not found: `{}`",&local_781);
      fmt::format<std::__cxx11::string>
                (local_760,(string *)local_780,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ext.field_2._M_local_buf + 8));
      poVar2 = ::std::operator<<((ostream *)local_740,(string *)local_760);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_760);
      ::std::__cxx11::string::~string(local_780);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_781);
      if (warn != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)warn,local_7a8);
        ::std::__cxx11::string::~string(local_7a8);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_740);
      ::std::__cxx11::ostringstream::ostringstream(local_920);
      poVar2 = ::std::operator<<((ostream *)local_920,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdc);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_960,"  current working path: `{}`",&local_961);
      fmt::format<std::__cxx11::string>
                (local_940,(string *)local_960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 current_working_path);
      poVar2 = ::std::operator<<((ostream *)local_920,(string *)local_940);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_940);
      ::std::__cxx11::string::~string(local_960);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_961);
      if (warn != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)warn,local_988);
        ::std::__cxx11::string::~string(local_988);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_920);
      ::std::__cxx11::ostringstream::ostringstream(local_b00);
      poVar2 = ::std::operator<<((ostream *)local_b00,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xde);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b40,"  resolver.current_working_path: `{}`",&local_b41);
      psVar3 = AssetResolutionResolver::current_working_path_abi_cxx11_(resolver);
      fmt::format<std::__cxx11::string>
                (local_b20,(string *)local_b40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
      poVar2 = ::std::operator<<((ostream *)local_b00,(string *)local_b20);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)local_b20);
      ::std::__cxx11::string::~string(local_b40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b41);
      if (warn != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)warn,local_b68);
        ::std::__cxx11::string::~string(local_b68);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_b00);
      ::std::__cxx11::ostringstream::ostringstream(local_ce0);
      poVar2 = ::std::operator<<((ostream *)local_ce0,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdf);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d20,"  search_paths: `{}`",&local_d21);
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_d00,(fmt *)local_d20,(string *)search_paths,pvVar12);
      poVar2 = ::std::operator<<((ostream *)local_ce0,(string *)&local_d00);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_d00);
      ::std::__cxx11::string::~string(local_d20);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d21);
      if (warn != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)warn,local_d48);
        ::std::__cxx11::string::~string(local_d48);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_ce0);
      ::std::__cxx11::ostringstream::ostringstream(local_ec0);
      poVar2 = ::std::operator<<((ostream *)local_ec0,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"LoadAsset");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe1);
      ::std::operator<<(poVar2," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f00,"  resolver.search_paths: `{}`",&local_f01);
      psVar3 = (string *)AssetResolutionResolver::search_paths_abi_cxx11_(resolver);
      fmt::format<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_ee0,(fmt *)local_f00,psVar3,pvVar12);
      poVar2 = ::std::operator<<((ostream *)local_ec0,(string *)&local_ee0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string((string *)&local_ee0);
      ::std::__cxx11::string::~string(local_f00);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f01);
      if (warn != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=
                  ((string *)warn,(string *)(base_dir.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(base_dir.field_2._M_local_buf + 8));
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_ec0);
      *dst_primspec_root = (PrimSpec *)0x0;
      resolver_local._7_1_ = 1;
      resolved_path.field_2._12_4_ = 1;
    }
    ::std::__cxx11::string::~string((string *)local_3e8);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_3a0);
    poVar2 = ::std::operator<<((ostream *)local_3a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"LoadAsset");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb4);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_3a0,
                               "TODO: No assetPath but Prim path(e.g. </xform>) in references.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_3c0);
      ::std::__cxx11::string::~string(local_3c0);
    }
    resolver_local._7_1_ = 0;
    resolved_path.field_2._12_4_ = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_3a0);
  }
  ::std::__cxx11::string::~string((string *)local_228);
  ::std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
LAB_002258ce:
  return (bool)(resolver_local._7_1_ & 1);
}

Assistant:

bool LoadAsset(AssetResolutionResolver &resolver,
               const std::string &current_working_path,
               const std::vector<std::string> &search_paths,
               const std::map<std::string, FileFormatHandler> &fileformats,
               const value::AssetPath &assetPath, const Path &primPath,
               Layer *dst_layer, const PrimSpec **dst_primspec_root,
               const bool error_when_no_prims_found,
               const bool error_when_asset_not_found,
               const bool error_when_unsupported_fileformat, std::string *warn,
               std::string *err) {
  if (!dst_layer) {
    PUSH_ERROR_AND_RETURN(
        "[Internal error]. `dst_layer` output arg is nullptr.");
  }

  std::string asset_path = assetPath.GetAssetPath();
  std::string ext = GetExtension(asset_path);

  if (asset_path.empty()) {
    PUSH_ERROR_AND_RETURN(
        "TODO: No assetPath but Prim path(e.g. </xform>) in references.");
  }

  // TODO: Use std::stack to manage AssetResolutionResolver state?
  if (current_working_path.size()) {
    resolver.set_current_working_path(current_working_path);
  }

  if (search_paths.size()) {
    resolver.set_search_paths(search_paths);
  }

  // resolve path
  // TODO: Store resolved path to Reference?
  std::string resolved_path = resolver.resolve(asset_path);

  DCOUT("Loading references: " << resolved_path
                               << ", asset_path: " << asset_path);

  if (resolved_path.empty()) {
    if (error_when_asset_not_found) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to resolve asset path `{}`", asset_path));
    } else {
      PUSH_WARN(fmt::format("Asset not found: `{}`", asset_path));
#if 0 // for debugging. print cwd.
#if defined(__linux__)
      char pathname[4096];
      memset(pathname, 0, 4096);
      char *pathname_p = getcwd(pathname, 4096);

      if (pathname_p == nullptr) {
        PUSH_ERROR_AND_RETURN(
            "Getting current working directory failed.");
      }

      PUSH_WARN(fmt::format("  cwd = {}", std::string(pathname_p)));
#endif
#endif
      PUSH_WARN(
          fmt::format("  current working path: `{}`", current_working_path));
      PUSH_WARN(fmt::format("  resolver.current_working_path: `{}`",
                            resolver.current_working_path()));
      PUSH_WARN(fmt::format("  search_paths: `{}`", search_paths));
      PUSH_WARN(fmt::format("  resolver.search_paths: `{}`",
                            resolver.search_paths()));
      (*dst_primspec_root) = nullptr;
      return true;
    }
  }

  resolver.set_search_paths(search_paths);

  // Use resolved asset_path's basedir for current working path.
  // Add resolved asset_path's basedir to search path.
  std::string base_dir = io::GetBaseDir(resolved_path);
  if (base_dir.size()) {
    DCOUT(fmt::format("Add `{}' to asset search path.", base_dir));

    resolver.set_current_working_path(base_dir);

    resolver.add_search_path(base_dir);
  }

  Asset asset;
  if (!resolver.open_asset(resolved_path, asset_path, &asset, warn, err)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to open asset `{}`.", resolved_path));
  }

  DCOUT("Opened resolved assst: " << resolved_path
                                  << ", asset_path: " << asset_path);

  if (IsBuiltinFileFormat(asset_path)) {
    if (IsUSDFileFormat(asset_path) || IsMtlxFileFormat(asset_path)) {
      // ok
    } else {
      // TODO: obj
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "TODO: Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "TODO: Unknown/unsupported asset file format. Skipped: {}",
            asset_path));
        return true;
      }
    }
  } else {
    if (fileformats.count(ext)) {
      DCOUT("Fileformat handler found for: " + ext);

    } else {
      DCOUT("Unknown/unsupported fileformat: " + ext);
      if (error_when_unsupported_fileformat) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Unknown/unsupported asset file format: {}", asset_path));
      } else {
        PUSH_WARN(fmt::format(
            "Unknown/unsupported asset file format. Skipped: {}", asset_path));
        return true;
      }
    }
  }

  Layer layer;
  std::string _warn;
  std::string _err;

  if (IsUSDFileFormat(asset_path)) {
    if (!LoadLayerFromMemory(asset.data(), asset.size(), asset_path, &layer,
                             &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open `{}` as Layer: {}", asset_path, _err));
    }
  } else if (IsMtlxFileFormat(asset_path)) {
    // primPath must be '</MaterialX>'
    if (primPath.prim_part() != "/MaterialX") {
      PUSH_ERROR_AND_RETURN("Prim path must be </MaterialX>, but got: " +
                            primPath.prim_part());
    }

    PrimSpec ps;
    if (!LoadMaterialXFromAsset(asset, asset_path, ps, &_warn, &_err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to open mtlx asset `{}`", asset_path));
    }

    ps.name() = "MaterialX";
    layer.primspecs()["MaterialX"] = ps;

  } else {
    if (fileformats.count(ext)) {
      PrimSpec ps;
      const FileFormatHandler &handler = fileformats.at(ext);

      if (!handler.reader(asset, ps, &_warn, &_err, handler.userdata)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to read asset `{}` error: {}",
                                          asset_path, _err));
      }

      if (ps.name().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "PrimSpec element_name is empty. asset `{}`", asset_path));
      }

      layer.primspecs()[ps.name()] = ps;
      DCOUT("Read asset from custom fileformat handler: " << ext);
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "FileFormat handler not found for asset `{}`", asset_path));
    }
  }

  DCOUT("layer = " << print_layer(layer, 0));

  // TODO: Recursively resolve `references`

  if (_warn.size()) {
    if (warn) {
      (*warn) += _warn;
    }
  }

  if (layer.primspecs().empty()) {
    if (error_when_no_prims_found) {
      PUSH_ERROR_AND_RETURN(fmt::format("No prims in layer `{}`", asset_path));
    }

    if (dst_primspec_root) {
      (*dst_primspec_root) = nullptr;
    }

    (*dst_layer) = std::move(layer);

    return true;
  }

  const PrimSpec *src_ps{nullptr};

  if (dst_primspec_root) {
    std::string default_prim;
    if (primPath.is_valid()) {
      default_prim = primPath.prim_part();
      DCOUT("primPath = " << default_prim);
    } else {
      // Use `defaultPrim` metadatum
      if (layer.metas().defaultPrim.valid()) {
        default_prim = "/" + layer.metas().defaultPrim.str();
        DCOUT("layer.meta.defaultPrim = " << default_prim);
      } else {
        // Use the first Prim in the layer.
        default_prim = "/" + layer.primspecs().begin()->first;
        DCOUT("layer.primspecs[0].name = " << default_prim);
      }
    }

    if (!layer.find_primspec_at(Path(default_prim, ""), &src_ps, err)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to find PrimSpec `{}` in layer `{}`(resolved path: `{}`)",
          default_prim, asset_path, resolved_path));
    }

    if (!src_ps) {
      PUSH_ERROR_AND_RETURN("Internal error: PrimSpec pointer is nullptr.");
    }

    if (!PropagateAssetResolverState(0, *const_cast<PrimSpec *>(src_ps),
                                     resolver.current_working_path(),
                                     resolver.search_paths())) {
      PUSH_ERROR_AND_RETURN(
          "Store AssetResolver state to each PrimSpec failed.\n");
    }

    (*dst_primspec_root) = src_ps;
  }

  // FIXME: This may be redundant, since assetresulution state is stored in
  // each PrimSpec.
  // TODO: Remove layer-level assetresulution state store?
  //
  // save assetresolution state for nested composition.
  layer.set_asset_resolution_state(resolver.current_working_path(),
                                   resolver.search_paths(),
                                   resolver.get_userdata());

  (*dst_layer) = std::move(layer);

  return true;
}